

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O1

void __thiscall
BackgroundParser::RemoveFromUnprocessedItems(BackgroundParser *this,BackgroundParseItem *item)

{
  if (this->unprocessedItemsHead == item) {
    this->unprocessedItemsHead = item->nextUnprocessedItem;
  }
  else {
    item->prevUnprocessedItem->nextUnprocessedItem = item->nextUnprocessedItem;
  }
  if (this->unprocessedItemsTail == item) {
    this->unprocessedItemsTail = item->prevUnprocessedItem;
  }
  else {
    item->nextUnprocessedItem->prevUnprocessedItem = item->prevUnprocessedItem;
  }
  item->nextUnprocessedItem = (BackgroundParseItem *)0x0;
  item->prevUnprocessedItem = (BackgroundParseItem *)0x0;
  return;
}

Assistant:

void BackgroundParser::RemoveFromUnprocessedItems(BackgroundParseItem *const item)
{
    if (this->unprocessedItemsHead == item)
    {
        this->unprocessedItemsHead = item->GetNextUnprocessedItem();
    }
    else
    {
        item->GetPrevUnprocessedItem()->SetNextUnprocessedItem(item->GetNextUnprocessedItem());
    }
    if (this->unprocessedItemsTail == item)
    {
        this->unprocessedItemsTail = item->GetPrevUnprocessedItem();
    }
    else
    {
        item->GetNextUnprocessedItem()->SetPrevUnprocessedItem(item->GetPrevUnprocessedItem());
    }
    item->SetNextUnprocessedItem(nullptr);
    item->SetPrevUnprocessedItem(nullptr);
}